

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

u8 getSafetyLevel(char *z,int omitFull,u8 dflt)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  uint N;
  int x;
  int local_34;
  
  if ((ulong)(byte)*z - 0x3a < 0xfffffffffffffff6) {
    sVar2 = strlen(z);
    N = (uint)sVar2 & 0x3fffffff;
    lVar3 = 0;
    do {
      if (((N == "\x02\x02\x03\x05\x03\x04\x05\x04"[lVar3]) &&
          (iVar1 = sqlite3_strnicmp("onoffalseyestruextrafull" + ""[lVar3],z,N), iVar1 == 0)) &&
         ((omitFull == 0 || (lVar3 + 0xfffffff8U < 0xfffffffe)))) {
        return "\x01"[lVar3];
      }
      lVar3 = lVar3 + 1;
      local_34._0_1_ = dflt;
    } while (lVar3 != 8);
  }
  else {
    local_34 = 0;
    sqlite3GetInt32(z,&local_34);
  }
  return (u8)local_34;
}

Assistant:

static u8 getSafetyLevel(const char *z, int omitFull, u8 dflt){
                             /* 123456789 123456789 123 */
  static const char zText[] = "onoffalseyestruextrafull";
  static const u8 iOffset[] = {0, 1, 2,  4,    9,  12,  15,   20};
  static const u8 iLength[] = {2, 2, 3,  5,    3,   4,   5,    4};
  static const u8 iValue[] =  {1, 0, 0,  0,    1,   1,   3,    2};
                            /* on no off false yes true extra full */
  int i, n;
  if( sqlite3Isdigit(*z) ){
    return (u8)sqlite3Atoi(z);
  }
  n = sqlite3Strlen30(z);
  for(i=0; i<ArraySize(iLength); i++){
    if( iLength[i]==n && sqlite3StrNICmp(&zText[iOffset[i]],z,n)==0
     && (!omitFull || iValue[i]<=1)
    ){
      return iValue[i];
    }
  }
  return dflt;
}